

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O3

void us_timer_set(us_timer_t *t,_func_void_us_timer_t_ptr *cb,int ms,int repeat_ms)

{
  itimerspec timer_spec;
  itimerspec local_28;
  
  *(_func_void_us_timer_t_ptr **)(t + 0x20) = cb;
  local_28.it_interval.tv_sec = (__time_t)(repeat_ms / 1000);
  local_28.it_interval.tv_nsec = ((long)repeat_ms * 1000000) % 1000000000;
  local_28.it_value.tv_sec = (__time_t)(ms / 1000);
  local_28.it_value.tv_nsec = ((long)ms * 1000000) % 1000000000;
  timerfd_settime((*(int *)t << 4) >> 4,0,&local_28,(itimerspec *)0x0);
  us_poll_start((us_poll_t *)t,*(us_loop_t **)(t + 0x10),1);
  return;
}

Assistant:

void us_timer_set(struct us_timer_t *t, void (*cb)(struct us_timer_t *t), int ms, int repeat_ms) {
    struct us_internal_callback_t *internal_cb = (struct us_internal_callback_t *) t;

    internal_cb->cb = (void (*)(struct us_internal_callback_t *)) cb;

    struct itimerspec timer_spec = {
        {repeat_ms / 1000, ((long)repeat_ms * 1000000) % 1000000000},
        {ms / 1000, ((long)ms * 1000000) % 1000000000}
    };

    timerfd_settime(us_poll_fd((struct us_poll_t *) t), 0, &timer_spec, NULL);
    us_poll_start((struct us_poll_t *) t, internal_cb->loop, LIBUS_SOCKET_READABLE);
}